

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait_test.c
# Opt level: O3

void consumer_mu_n(testing t,mu_queue *q,int start,int count)

{
  nsync_mu *mu;
  int iVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  nsync_time abs_deadline;
  
  mu = &q->mu;
  uVar4 = 0;
  do {
    nsync_mu_lock(mu);
    abs_deadline.tv_nsec = 999999999;
    abs_deadline.tv_sec = 0x7fffffffffffffff;
    iVar2 = nsync_mu_wait_with_deadline
                      (mu,mu_queue_non_empty,q,(_func_int_void_ptr_void_ptr *)0x0,abs_deadline,
                       (nsync_note)0x0);
    if (iVar2 == 0) {
      iVar2 = q->count;
      if (iVar2 == 0) {
        testing_panic("q->count == 0");
        iVar2 = q->count;
      }
      iVar1 = q->pos;
      pvVar6 = q->data[iVar1];
      q->data[iVar1] = (void *)0x0;
      q->pos = iVar1 + 1;
      q->count = iVar2 + -1;
      if (iVar1 + 1 == q->limit) {
        q->pos = 0;
      }
      nsync_mu_unlock(mu);
      if (pvVar6 == (void *)0x0) goto LAB_00103e8b;
    }
    else {
      nsync_mu_unlock(mu);
LAB_00103e8b:
      pcVar3 = smprintf("mu_queue_get() returned 0 with no deadline");
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/testing/mu_wait_test.c"
                     ,0x80,pcVar3);
      pvVar6 = (void *)0x0;
    }
    uVar5 = (int)pvVar6 - 0x10b179;
    if (uVar4 != uVar5) {
      pcVar3 = smprintf("mu_queue_get() returned bad value; want %d, got %d",(ulong)uVar4,
                        (ulong)uVar5);
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/testing/mu_wait_test.c"
                     ,0x85,pcVar3);
    }
    uVar4 = uVar4 + 3;
    if (uVar4 == 300000) {
      return;
    }
  } while( true );
}

Assistant:

static void consumer_mu_n (testing t, mu_queue *q, int start, int count) {
	int i;
	for (i = 0; i != count; i++) {
		void *v = mu_queue_get (q, nsync_time_no_deadline);
		int x;
		if (v == NULL) {
			TEST_FATAL (t, ("mu_queue_get() returned 0 with no deadline"));
		}
		x = PTR_TO_INT (v);
		if (x != (start+i)*3) {
			TEST_FATAL (t, ("mu_queue_get() returned bad value; want %d, got %d",
				   (start+i)*3, x));
		}
	}
}